

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O1

void __thiscall LexerReadIdent::Run(LexerReadIdent *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  string ident;
  Lexer lexer;
  string local_70;
  Lexer local_50;
  
  Lexer::Lexer(&local_50,"foo baR baz_123 foo-bar");
  pTVar1 = g_current_test;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  bVar2 = Lexer::ReadIdent(&local_50,&local_70);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x2d,"lexer.ReadIdent(&ident)");
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  testing::Test::Check
            (pTVar1,iVar3 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x2e,"\"foo\" == ident");
  pTVar1 = g_current_test;
  bVar2 = Lexer::ReadIdent(&local_50,&local_70);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x2f,"lexer.ReadIdent(&ident)");
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  testing::Test::Check
            (pTVar1,iVar3 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x30,"\"baR\" == ident");
  pTVar1 = g_current_test;
  bVar2 = Lexer::ReadIdent(&local_50,&local_70);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x31,"lexer.ReadIdent(&ident)");
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  testing::Test::Check
            (pTVar1,iVar3 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x32,"\"baz_123\" == ident");
  pTVar1 = g_current_test;
  bVar2 = Lexer::ReadIdent(&local_50,&local_70);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x33,"lexer.ReadIdent(&ident)");
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  testing::Test::Check
            (pTVar1,iVar3 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x34,"\"foo-bar\" == ident");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST(Lexer, ReadIdent) {
  Lexer lexer("foo baR baz_123 foo-bar");
  string ident;
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("foo", ident);
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("baR", ident);
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("baz_123", ident);
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("foo-bar", ident);
}